

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnGameOver
          (RenX_LoggingPlugin *this,Server *server,WinType winType,TeamType *team,int gScore,
          int nScore)

{
  TeamType TVar1;
  TeamType TVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  string msg;
  string local_60;
  code *local_40;
  Server *local_38;
  
  local_38 = server;
  TVar2 = RenX::getEnemy(*team);
  TVar1 = *team;
  uVar3 = nScore;
  if (TVar1 == Nod) {
    uVar3 = gScore;
  }
  uVar6 = (ulong)(uint)gScore;
  if (TVar1 == Nod) {
    uVar6 = (ulong)(uint)nScore;
  }
  if ((*(ulong *)&this->field_0xa0 >> 0x36 & 1) == 0) {
    local_40 = RenX::Server::sendAdmChan;
  }
  else {
    local_40 = RenX::Server::sendLogChan;
  }
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  uVar5 = 0x930;
  if (winType == Tie) {
    uVar5 = (ulong)(TVar1 == None) << 5 | 0x950;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (&this->super_Plugin + uVar5));
  if (*team != None && msg._M_string_length != 0) {
    uVar4 = *(undefined8 *)(RenX::tags + 0x3a8);
    uVar7 = *(undefined8 *)(RenX::tags + 0x3b0);
    auVar8 = RenX::getTeamColor(*team);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0x3c8);
    uVar7 = *(undefined8 *)(RenX::tags + 0x3d0);
    auVar8 = RenX::getTeamName(*team);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 1000);
    uVar7 = *(undefined8 *)(RenX::tags + 0x3f0);
    auVar8 = RenX::getFullTeamName(*team);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0x1548);
    uVar7 = *(undefined8 *)(RenX::tags + 0x1550);
    string_printf_abi_cxx11_(&local_60,"%d",uVar6);
    RenX::replace_tag(&msg,uVar7,uVar4,local_60._M_string_length,local_60._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_60);
    uVar4 = *(undefined8 *)(RenX::tags + 0x1568);
    uVar7 = *(undefined8 *)(RenX::tags + 0x1570);
    string_printf_abi_cxx11_(&local_60,"%d",(ulong)uVar3);
    RenX::replace_tag(&msg,uVar7,uVar4,local_60._M_string_length,local_60._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_60);
    uVar4 = *(undefined8 *)(RenX::tags + 0xa08);
    uVar7 = *(undefined8 *)(RenX::tags + 0xa10);
    auVar8 = RenX::getTeamColor(TVar2);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0xa28);
    uVar7 = *(undefined8 *)(RenX::tags + 0xa30);
    auVar8 = RenX::getTeamName(TVar2);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0xa48);
    uVar7 = *(undefined8 *)(RenX::tags + 0xa50);
    auVar8 = RenX::getFullTeamName(TVar2);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0x1508);
    uVar7 = *(undefined8 *)(RenX::tags + 0x1510);
    auVar8 = RenX::translateWinType(winType);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    (*local_40)(local_38,msg._M_string_length,msg._M_dataplus._M_p);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&msg,&this->gameOverScoreFmt);
  if (*team == None) {
    if (msg._M_string_length == 0) goto LAB_00113e8b;
    uVar4 = *(undefined8 *)(RenX::tags + 0x3a8);
    uVar7 = *(undefined8 *)(RenX::tags + 0x3b0);
    auVar8 = RenX::getTeamColor(GDI);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0x3c8);
    uVar7 = *(undefined8 *)(RenX::tags + 0x3d0);
    auVar8 = RenX::getTeamName(GDI);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 1000);
    uVar7 = *(undefined8 *)(RenX::tags + 0x3f0);
    auVar8 = RenX::getFullTeamName(GDI);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0x1548);
    uVar7 = *(undefined8 *)(RenX::tags + 0x1550);
    string_printf_abi_cxx11_(&local_60,"%d",uVar6);
    RenX::replace_tag(&msg,uVar7,uVar4,local_60._M_string_length,local_60._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_60);
    uVar4 = *(undefined8 *)(RenX::tags + 0x1568);
    uVar7 = *(undefined8 *)(RenX::tags + 0x1570);
    string_printf_abi_cxx11_(&local_60,"%d",(ulong)uVar3);
    RenX::replace_tag(&msg,uVar7,uVar4,local_60._M_string_length,local_60._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_60);
    uVar4 = *(undefined8 *)(RenX::tags + 0xa08);
    uVar7 = *(undefined8 *)(RenX::tags + 0xa10);
    auVar8 = RenX::getTeamColor(Nod);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0xa28);
    uVar7 = *(undefined8 *)(RenX::tags + 0xa30);
    auVar8 = RenX::getTeamName(Nod);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0xa48);
    uVar7 = *(undefined8 *)(RenX::tags + 0xa50);
    auVar8 = RenX::getFullTeamName(Nod);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0x1508);
    uVar7 = *(undefined8 *)(RenX::tags + 0x1510);
    auVar8 = RenX::translateWinType(winType);
  }
  else {
    if (msg._M_string_length == 0) goto LAB_00113e8b;
    uVar4 = *(undefined8 *)(RenX::tags + 0x3a8);
    uVar7 = *(undefined8 *)(RenX::tags + 0x3b0);
    auVar8 = RenX::getTeamColor(*team);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0x3c8);
    uVar7 = *(undefined8 *)(RenX::tags + 0x3d0);
    auVar8 = RenX::getTeamName(*team);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 1000);
    uVar7 = *(undefined8 *)(RenX::tags + 0x3f0);
    auVar8 = RenX::getFullTeamName(*team);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0x1548);
    uVar7 = *(undefined8 *)(RenX::tags + 0x1550);
    string_printf_abi_cxx11_(&local_60,"%d",uVar6);
    RenX::replace_tag(&msg,uVar7,uVar4,local_60._M_string_length,local_60._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_60);
    uVar4 = *(undefined8 *)(RenX::tags + 0x1568);
    uVar7 = *(undefined8 *)(RenX::tags + 0x1570);
    string_printf_abi_cxx11_(&local_60,"%d",(ulong)uVar3);
    RenX::replace_tag(&msg,uVar7,uVar4,local_60._M_string_length,local_60._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_60);
    uVar4 = *(undefined8 *)(RenX::tags + 0xa08);
    uVar7 = *(undefined8 *)(RenX::tags + 0xa10);
    auVar8 = RenX::getTeamColor(TVar2);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0xa28);
    uVar7 = *(undefined8 *)(RenX::tags + 0xa30);
    auVar8 = RenX::getTeamName(TVar2);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0xa48);
    uVar7 = *(undefined8 *)(RenX::tags + 0xa50);
    auVar8 = RenX::getFullTeamName(TVar2);
    RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
    uVar4 = *(undefined8 *)(RenX::tags + 0x1508);
    uVar7 = *(undefined8 *)(RenX::tags + 0x1510);
    auVar8 = RenX::translateWinType(winType);
  }
  RenX::replace_tag(&msg,uVar7,uVar4,auVar8._0_8_,auVar8._8_8_);
  (*local_40)(local_38,msg._M_string_length,msg._M_dataplus._M_p);
LAB_00113e8b:
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnGameOver(RenX::Server &server, RenX::WinType winType, const RenX::TeamType &team, int gScore, int nScore)
{
	RenX::TeamType loserTeam = RenX::getEnemy(team);
	int winScore;
	int loseScore;
	switch (team)
	{
	default:
	case RenX::TeamType::GDI:
		winScore = gScore;
		loseScore = nScore;
		break;
	case RenX::TeamType::Nod:
		winScore = nScore;
		loseScore = gScore;
		break;
	}

	logFuncType func;
	if (RenX_LoggingPlugin::gameOverPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg;
	if (winType == RenX::WinType::Tie)
	{
		if (team == RenX::TeamType::None)
			msg = this->gameOverTieNoWinFmt;
		else
			msg = this->gameOverTieFmt;
	}
	else
		msg = this->gameOverFmt;

	if (!msg.empty() && team != RenX::TeamType::None)
	{
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_WIN_SCORE_TAG, string_printf("%d", winScore));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_LOSE_SCORE_TAG, string_printf("%d", loseScore));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, RenX::translateWinType(winType));
		(server.*func)(msg);
	}

	msg = this->gameOverScoreFmt;
	if (team == RenX::TeamType::None)
	{
		if (!msg.empty())
		{
			RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(RenX::TeamType::GDI));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(RenX::TeamType::GDI));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(RenX::TeamType::GDI));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_WIN_SCORE_TAG, string_printf("%d", winScore));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_LOSE_SCORE_TAG, string_printf("%d", loseScore));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(RenX::TeamType::Nod));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(RenX::TeamType::Nod));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(RenX::TeamType::Nod));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, RenX::translateWinType(winType));
			(server.*func)(msg);
		}
	}
	else if (!msg.empty())
	{
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_WIN_SCORE_TAG, string_printf("%d", winScore));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_LOSE_SCORE_TAG, string_printf("%d", loseScore));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, RenX::translateWinType(winType));
		(server.*func)(msg);
	}
}